

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event_loop.cpp
# Opt level: O0

void __thiscall
cppurses::detail::Timer_event_loop::register_widget(Timer_event_loop *this,Widget *w)

{
  int iVar1;
  pair<std::_Rb_tree_const_iterator<cppurses::Widget_*>,_bool> pVar2;
  anon_class_8_1_8991fb9c local_88;
  Slot<void_(cppurses::Widget_&),_std::function<void_(cppurses::Widget_&)>_> local_80;
  Signal<void_(cppurses::Widget_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(cppurses::Widget_&)>,_std::mutex>
  local_40;
  _Base_ptr local_30;
  undefined1 local_28;
  Widget *local_20;
  Widget *local_18;
  Widget *w_local;
  Timer_event_loop *this_local;
  
  local_20 = w;
  local_18 = w;
  w_local = (Widget *)this;
  pVar2 = std::set<cppurses::Widget*,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
          ::emplace<cppurses::Widget*>
                    ((set<cppurses::Widget*,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
                      *)&this->registered_widgets_,&local_20);
  local_30 = (_Base_ptr)pVar2.first._M_node;
  local_28 = pVar2.second;
  iVar1 = (int)local_18;
  local_88.this = this;
  sig::Slot<void(cppurses::Widget&),std::function<void(cppurses::Widget&)>>::
  Slot<cppurses::detail::Timer_event_loop::register_widget(cppurses::Widget&)::__0>
            ((Slot<void(cppurses::Widget&),std::function<void(cppurses::Widget&)>> *)&local_80,
             &local_88);
  sig::
  Signal<void_(cppurses::Widget_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(cppurses::Widget_&)>,_std::mutex>
  ::connect(&local_40,iVar1 + 0x268,(sockaddr *)&local_80,1);
  sig::Connection::~Connection((Connection *)&local_40);
  sig::Slot<void_(cppurses::Widget_&),_std::function<void_(cppurses::Widget_&)>_>::~Slot(&local_80);
  return;
}

Assistant:

void Timer_event_loop::register_widget(Widget& w)
{
    registered_widgets_.emplace(&w);
    w.destroyed.connect([this](Widget& d) { registered_widgets_.erase(&d); });
}